

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                     *(sysbvm_tuple_t *)(*arguments + 0x30));
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;
    return sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, *compiler, (*referenceNode)->binding);
}